

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

void __thiscall
cmCTestScriptHandler::AddCTestCommand
          (cmCTestScriptHandler *this,string *name,
          unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *command)

{
  cmCTest *pcVar1;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *name_00;
  pointer pcVar2;
  pointer this_00;
  cmState *this_01;
  unique_ptr<cmCommand,_std::default_delete<cmCommand>_> local_28;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *local_20;
  unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *command_local;
  string *name_local;
  cmCTestScriptHandler *this_local;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_20 = command;
  command_local = (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)name;
  name_local = (string *)this;
  pcVar2 = std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::operator->
                     (command);
  pcVar2->CTest = pcVar1;
  pcVar2 = std::unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_>::operator->
                     (command);
  pcVar2->CTestScriptHandler = this;
  this_00 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMake);
  this_01 = cmake::GetState(this_00);
  name_00 = command_local;
  std::unique_ptr<cmCommand,std::default_delete<cmCommand>>::
  unique_ptr<cmCTestCommand,std::default_delete<cmCTestCommand>,void>
            ((unique_ptr<cmCommand,std::default_delete<cmCommand>> *)&local_28,command);
  cmState::AddBuiltinCommand(this_01,(string *)name_00,&local_28);
  std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::~unique_ptr(&local_28);
  return;
}

Assistant:

void cmCTestScriptHandler::AddCTestCommand(
  std::string const& name, std::unique_ptr<cmCTestCommand> command)
{
  command->CTest = this->CTest;
  command->CTestScriptHandler = this;
  this->CMake->GetState()->AddBuiltinCommand(name, std::move(command));
}